

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGdR1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long v1;
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  TcParseTableBase *field;
  TcParseTableBase *pTVar10;
  MessageLite *pMVar11;
  ulong uVar12;
  char *pcVar13;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  int iVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int iVar16;
  long v1_00;
  TcParseTableBase *ptr_00;
  uint *puVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  LogMessageFatal local_88;
  uint64_t local_78;
  MessageLite *local_70;
  TcParseTableBase *local_68;
  undefined4 in_stack_ffffffffffffffa0;
  TcParseTableBase *table_00;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar13 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar13;
  }
  field = (TcParseTableBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)field & 7) != 0) {
    AlignFail(field);
  }
  bVar3 = *ptr;
  aVar14.data = (ulong)data.field_0 >> 0x18 & 0xff;
  local_78 = hasbits;
  local_70 = msg;
  local_68 = table;
  pTVar10 = MessageLite::GetTcParseTable
                      (*(MessageLite **)
                        ((long)&table->has_bits_offset + aVar14.data * 8 + (ulong)table->aux_offset)
                      );
  uVar9 = (uint)bVar3;
  table_00 = pTVar10;
  do {
    ptr_00 = field;
    pMVar11 = AddMessage(table_00,(RepeatedPtrFieldBase *)field);
    auVar18._8_8_ = extraout_RDX;
    auVar18._0_8_ = local_88.super_LogMessage._0_8_;
    iVar15 = ctx->depth_;
    v1 = (long)iVar15 + -1;
    iVar7 = (int)v1;
    ctx->depth_ = iVar7;
    if ((long)iVar15 < 1) goto LAB_0020ed98;
    local_88.super_LogMessage._0_8_ = (long)&((TcParseTableBase *)ptr)->has_bits_offset + 1;
    iVar4 = ctx->group_depth_;
    v1_00 = (long)iVar4 + 1;
    iVar16 = (int)v1_00;
    ctx->group_depth_ = iVar16;
    while( true ) {
      bVar6 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)&local_88,ctx->group_depth_);
      auVar18._8_8_ = extraout_RDX_00;
      auVar18._0_8_ = local_88.super_LogMessage._0_8_;
      if (bVar6) break;
      uVar8 = (uint)pTVar10->fast_idx_mask & (uint)*(ushort *)local_88.super_LogMessage._0_8_;
      if ((uVar8 & 7) != 0) goto LAB_0020eea7;
      uVar12 = (ulong)(uVar8 & 0xfffffff8);
      aVar14.data = (ulong)*(ushort *)local_88.super_LogMessage._0_8_ ^
                    *(ulong *)(&pTVar10[1].fast_idx_mask + uVar12 * 2);
      auVar18 = (**(code **)(&pTVar10[1].has_bits_offset + uVar12))
                          (pMVar11,local_88.super_LogMessage._0_8_,ctx,aVar14.data,pTVar10,0);
      local_88.super_LogMessage._0_8_ = auVar18._0_8_;
      if (((TcParseTableBase *)local_88.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    local_88.super_LogMessage._0_8_ = auVar18._0_8_;
    if ((pTVar10->field_0x9 & 1) == 0) {
      ptr = (char *)local_88.super_LogMessage._0_8_;
      if ((TcParseTableBase *)local_88.super_LogMessage._0_8_ == (TcParseTableBase *)0x0) {
        ptr_00 = pTVar10;
        VerifyHasBitConsistency((MessageLite *)CONCAT44(uVar9,in_stack_ffffffffffffffa0),table_00);
        auVar19._8_8_ = extraout_RDX_01;
        auVar19._0_8_ = local_88.super_LogMessage._0_8_;
        goto LAB_0020ed6b;
      }
    }
    else {
      ptr_00 = (TcParseTableBase *)local_88.super_LogMessage._0_8_;
      auVar19 = (undefined1  [16])
                (*pTVar10->post_loop_handler)(pMVar11,(char *)local_88.super_LogMessage._0_8_,ctx);
LAB_0020ed6b:
      auVar18._8_8_ = auVar19._8_8_;
      auVar18._0_8_ = local_88.super_LogMessage._0_8_;
      ptr = (char *)auVar19._0_8_;
      if (auVar19._0_8_ == (TcParseTableBase *)0x0) {
        uVar1 = ctx->depth_;
        uVar2 = ctx->group_depth_;
        ctx->depth_ = uVar1 + 1;
        ctx->group_depth_ = uVar2 + -1;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        goto LAB_0020ed98;
      }
    }
    local_88.super_LogMessage._0_8_ = auVar18._0_8_;
    if (iVar7 != ctx->depth_) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (v1,(long)ctx->depth_,"old_depth == depth_");
      iVar15 = 0x491;
LAB_0020ee40:
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                 ,iVar15,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_88);
    }
    ptr_00 = (TcParseTableBase *)(long)ctx->group_depth_;
    if (iVar16 != ctx->group_depth_) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              (v1_00,(long)ptr_00,"old_group_depth == group_depth_");
      iVar15 = 0x492;
      goto LAB_0020ee40;
    }
    ctx->group_depth_ = iVar4;
    ctx->depth_ = iVar15;
    uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    if (uVar5 != uVar9) {
LAB_0020ed98:
      local_88.super_LogMessage._0_8_ = auVar18._0_8_;
      pcVar13 = Error(local_70,(char *)ptr_00,auVar18._8_8_,(TcFieldData)aVar14,local_68,local_78);
      return pcVar13;
    }
    if ((TcParseTableBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)local_68->has_bits_offset != 0) {
        puVar17 = (uint *)((long)&local_70->_vptr_MessageLite + (ulong)local_68->has_bits_offset);
        if (((ulong)puVar17 & 3) != 0) {
          AlignFail();
        }
        *puVar17 = *puVar17 | (uint)local_78;
      }
      return (char *)(TcParseTableBase *)ptr;
    }
    if (*(char *)&((TcParseTableBase *)ptr)->has_bits_offset != (char)uVar9) {
      uVar9 = (uint)local_68->fast_idx_mask & (uint)((TcParseTableBase *)ptr)->has_bits_offset;
      if ((uVar9 & 7) == 0) {
        uVar12 = (ulong)(uVar9 & 0xfffffff8);
        pcVar13 = (char *)(**(code **)(&local_68[1].has_bits_offset + uVar12))
                                    (local_70,ptr,ctx,
                                     (ulong)((TcParseTableBase *)ptr)->has_bits_offset ^
                                     *(ulong *)(&local_68[1].fast_idx_mask + uVar12 * 2),local_68,
                                     local_78);
        return pcVar13;
      }
LAB_0020eea7:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdR1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint8_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}